

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
pbrt::
InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::operator=(InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *this,InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *other)

{
  size_t sVar1;
  size_t i;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  string *psVar5;
  int i_1;
  long lVar6;
  ulong uVar7;
  string *this_00;
  
  if (this != other) {
    clear(this);
    if ((this->alloc).memoryResource == (other->alloc).memoryResource) {
      pbVar4 = this->ptr;
      this->ptr = other->ptr;
      other->ptr = pbVar4;
      sVar1 = this->nAlloc;
      this->nAlloc = other->nAlloc;
      other->nAlloc = sVar1;
      sVar1 = this->nStored;
      this->nStored = other->nStored;
      other->nStored = sVar1;
      uVar2 = this->nStored;
      if ((uVar2 != 0) &&
         (this->ptr == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        this_00 = (string *)&this->field_2;
        psVar5 = (string *)&other->field_2;
        for (uVar7 = 0; uVar7 < uVar2; uVar7 = uVar7 + 1) {
          std::__cxx11::string::string(this_00,psVar5);
          uVar2 = this->nStored;
          this_00 = this_00 + 0x20;
          psVar5 = psVar5 + 0x20;
        }
        other->nStored = uVar2;
      }
    }
    else {
      reserve(this,other->nStored);
      lVar6 = 0;
      for (uVar2 = 0; uVar2 < other->nStored; uVar2 = uVar2 + 1) {
        pbVar4 = this->ptr;
        if (this->ptr == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &this->field_2;
        }
        pbVar3 = other->ptr;
        if (other->ptr == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &other->field_2;
        }
        std::__cxx11::string::string
                  ((string *)((long)&pbVar4->_M_dataplus + lVar6),
                   (string *)((long)&pbVar3->_M_dataplus + lVar6));
        lVar6 = lVar6 + 0x20;
      }
      this->nStored = other->nStored;
    }
  }
  return this;
}

Assistant:

InlinedVector &operator=(InlinedVector &&other) {
        if (this == &other)
            return *this;

        clear();
        if (alloc == other.alloc) {
            pstd::swap(ptr, other.ptr);
            pstd::swap(nAlloc, other.nAlloc);
            pstd::swap(nStored, other.nStored);
            if (nStored > 0 && ptr == nullptr) {
                for (int i = 0; i < nStored; ++i)
                    alloc.template construct<T>(fixed + i, std::move(other.fixed[i]));
                other.nStored = nStored;  // so that dtors run...
            }
        } else {
            reserve(other.size());
            for (size_t i = 0; i < other.size(); ++i)
                alloc.template construct<T>(begin() + i, std::move(other[i]));
            nStored = other.size();
        }

        return *this;
    }